

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.h
# Opt level: O3

bool __thiscall re2::Prog::Inst::greedy(Inst *this,Prog *p)

{
  uint uVar1;
  uint uVar2;
  
  if ((this->out_opcode_ & 7) != 1) {
    __assert_fail("(opcode()) == (kInstAltMatch)",
                  "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/prog.h",0x76
                  ,"bool re2::Prog::Inst::greedy(Prog *)");
  }
  uVar1 = p->inst_[this->out_opcode_ >> 4].out_opcode_;
  uVar2 = uVar1 & 7;
  if (uVar2 != 2) {
    if (uVar2 == 6) {
      return (p->inst_[uVar1 >> 4].out_opcode_ & 7) == 2;
    }
    return false;
  }
  return true;
}

Assistant:

InstOp opcode() { return static_cast<InstOp>(out_opcode_&7); }